

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOFX_echo.c
# Opt level: O2

uint32_t FAPOFXCreateEcho(FAPO **pEffect,void *pInitData,uint32_t InitDataByteSize,
                         FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                         FAudioReallocFunc customRealloc,uint8_t legacy)

{
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  ulong uVar1;
  FAPORegistrationProperties *pRegistrationProperties;
  uint8_t *puVar2;
  FAPOFXEchoParameters fxdefault;
  
  fxdefault.WetDryMix = 0.5;
  fxdefault.Feedback = 0.5;
  fxdefault.Delay = 500.0;
  fapo = (FAPOBase *)(*customMalloc)(0xe0);
  pParameterBlocks = (uint8_t *)(*customMalloc)(0x24);
  if (pInitData == (void *)0x0) {
    SDL_memset(pParameterBlocks,0,0x24);
    pInitData = &fxdefault;
    uVar1 = 0xc;
    SDL_memcpy(pParameterBlocks,pInitData,0xc);
    SDL_memcpy(pParameterBlocks + 0xc,pInitData,0xc);
    puVar2 = pParameterBlocks + 0x18;
  }
  else {
    uVar1 = (ulong)InitDataByteSize;
    SDL_memcpy(pParameterBlocks,pInitData,uVar1);
    SDL_memcpy(pParameterBlocks + uVar1,pInitData,uVar1);
    puVar2 = pParameterBlocks + InitDataByteSize * 2;
  }
  SDL_memcpy(puVar2,pInitData,uVar1);
  pRegistrationProperties = &FXEchoProperties_LEGACY;
  SDL_memcpy(&FXEchoProperties_LEGACY,&FAPOFX_CLSID_FXEcho_LEGACY,0x10);
  SDL_memcpy(&FXEchoProperties,&FAPOFX_CLSID_FXEcho,0x10);
  if (legacy == '\0') {
    pRegistrationProperties = &FXEchoProperties;
  }
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,pRegistrationProperties,pParameterBlocks,0xc,'\0',customMalloc,customFree,
             customRealloc);
  (fapo->base).Initialize = FAPOFXEcho_Initialize;
  (fapo->base).Process = FAPOFXEcho_Process;
  fapo->Destructor = FAPOFXEcho_Free;
  *pEffect = (FAPO *)fapo;
  return 0;
}

Assistant:

uint32_t FAPOFXCreateEcho(
	FAPO **pEffect,
	const void *pInitData,
	uint32_t InitDataByteSize,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc,
	uint8_t legacy
) {
	const FAPOFXEchoParameters fxdefault =
	{
		FAPOFXECHO_DEFAULT_WETDRYMIX,
		FAPOFXECHO_DEFAULT_FEEDBACK,
		FAPOFXECHO_DEFAULT_DELAY
	};

	/* Allocate... */
	FAPOFXEcho *result = (FAPOFXEcho*) customMalloc(
		sizeof(FAPOFXEcho)
	);
	uint8_t *params = (uint8_t*) customMalloc(
		sizeof(FAPOFXEchoParameters) * 3
	);
	if (pInitData == NULL)
	{
		FAudio_zero(params, sizeof(FAPOFXEchoParameters) * 3);
		#define INITPARAMS(offset) \
			FAudio_memcpy( \
				params + sizeof(FAPOFXEchoParameters) * offset, \
				&fxdefault, \
				sizeof(FAPOFXEchoParameters) \
			);
		INITPARAMS(0)
		INITPARAMS(1)
		INITPARAMS(2)
		#undef INITPARAMS
	}
	else
	{
		FAudio_assert(InitDataByteSize == sizeof(FAPOFXEchoParameters));
		FAudio_memcpy(params, pInitData, InitDataByteSize);
		FAudio_memcpy(params + InitDataByteSize, pInitData, InitDataByteSize);
		FAudio_memcpy(params + (InitDataByteSize * 2), pInitData, InitDataByteSize);
	}

	/* Initialize... */
	FAudio_memcpy(
		&FXEchoProperties_LEGACY.clsid,
		&FAPOFX_CLSID_FXEcho_LEGACY,
		sizeof(FAudioGUID)
	);
	FAudio_memcpy(
		&FXEchoProperties.clsid,
		&FAPOFX_CLSID_FXEcho,
		sizeof(FAudioGUID)
	);
	CreateFAPOBaseWithCustomAllocatorEXT(
		&result->base,
		legacy ? &FXEchoProperties_LEGACY : &FXEchoProperties,
		params,
		sizeof(FAPOFXEchoParameters),
		0,
		customMalloc,
		customFree,
		customRealloc
	);

	/* Function table... */
	result->base.base.Initialize = (InitializeFunc)
		FAPOFXEcho_Initialize;
	result->base.base.Process = (ProcessFunc)
		FAPOFXEcho_Process;
	result->base.Destructor = FAPOFXEcho_Free;

	/* Finally. */
	*pEffect = &result->base.base;
	return 0;
}